

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

int64_t __thiscall
llvm::DataExtractor::getSigned(DataExtractor *this,uint64_t *offset_ptr,uint32_t byte_size)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int64_t iVar4;
  uint64_t uVar5;
  
  switch(byte_size) {
  case 1:
    uVar1 = getU8(this,offset_ptr,(Error *)0x0);
    iVar4 = (int64_t)(char)uVar1;
    break;
  case 2:
    uVar2 = getU16(this,offset_ptr,(Error *)0x0);
    iVar4 = (int64_t)(short)uVar2;
    break;
  default:
    llvm_unreachable_internal
              ("getSigned unhandled case!",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
               ,0x97);
  case 4:
    uVar3 = getU32(this,offset_ptr,(Error *)0x0);
    iVar4 = (int64_t)(int)uVar3;
    break;
  case 8:
    uVar5 = getU64(this,offset_ptr,(Error *)0x0);
    return uVar5;
  }
  return iVar4;
}

Assistant:

int64_t
DataExtractor::getSigned(uint64_t *offset_ptr, uint32_t byte_size) const {
  switch (byte_size) {
  case 1:
    return (int8_t)getU8(offset_ptr);
  case 2:
    return (int16_t)getU16(offset_ptr);
  case 4:
    return (int32_t)getU32(offset_ptr);
  case 8:
    return (int64_t)getU64(offset_ptr);
  }
  llvm_unreachable("getSigned unhandled case!");
}